

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O0

void __thiscall LowererMD::LowerTypeof(LowererMD *this,Instr *typeOfInstr)

{
  Func *func_00;
  code *pcVar1;
  bool bVar2;
  BYTE scale;
  int iVar3;
  DWORD DVar4;
  uint32 uVar5;
  Opnd *this_00;
  Opnd *this_01;
  undefined4 *puVar6;
  LabelInstr *target;
  LabelInstr *labelTarget;
  LabelInstr *target_00;
  RegOpnd *baseOpnd;
  ScriptContextInfo *pSVar7;
  undefined4 extraout_var;
  AddrOpnd *src;
  RegOpnd *indexOpnd;
  IntConstOpnd *pIVar8;
  RegOpnd *baseOpnd_00;
  RegOpnd *pRVar9;
  IndirOpnd *pIVar10;
  Instr *instr;
  Opnd *flagsOpnd;
  RegOpnd *typeIdUndefinedOpnd;
  RegOpnd *objTypeIdOpnd;
  RegOpnd *typeRegOpnd;
  RegOpnd *typeIdOpnd;
  RegOpnd *typeDisplayStringsArrayOpnd;
  LabelInstr *doneLabel;
  LabelInstr *taggedIntLabel;
  LabelInstr *helperLabel;
  Opnd *dst;
  Opnd *src1;
  Func *func;
  Instr *typeOfInstr_local;
  LowererMD *this_local;
  
  func_00 = typeOfInstr->m_func;
  this_00 = IR::Instr::GetSrc1(typeOfInstr);
  this_01 = IR::Instr::GetDst(typeOfInstr);
  bVar2 = IR::Opnd::IsRegOpnd(this_00);
  if ((!bVar2) || (bVar2 = IR::Opnd::IsRegOpnd(this_01), !bVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x2221,"(src1->IsRegOpnd() && dst->IsRegOpnd())",
                       "src1->IsRegOpnd() && dst->IsRegOpnd()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  target = IR::LabelInstr::New(Label,func_00,true);
  labelTarget = IR::LabelInstr::New(Label,func_00,false);
  target_00 = IR::LabelInstr::New(Label,func_00,false);
  baseOpnd = IR::RegOpnd::New(TyUint64,func_00);
  pSVar7 = Func::GetScriptContextInfo(this->m_func);
  iVar3 = (*pSVar7->_vptr_ScriptContextInfo[0x16])();
  DVar4 = Js::JavascriptLibrary::GetTypeDisplayStringsOffset();
  src = IR::AddrOpnd::New((Var)(CONCAT44(extraout_var,iVar3) + (ulong)DVar4),
                          AddrOpndKindConstantAddress,this->m_func,false,(Var)0x0);
  Lowerer::InsertMove(&baseOpnd->super_Opnd,&src->super_Opnd,typeOfInstr,true);
  GenerateObjectTest(this,this_00,typeOfInstr,labelTarget,false);
  indexOpnd = IR::RegOpnd::New(TyUint32,func_00);
  pIVar8 = IR::IntConstOpnd::New(0x1c,TyUint32,func_00,false);
  Lowerer::InsertMove(&indexOpnd->super_Opnd,&pIVar8->super_Opnd,typeOfInstr,true);
  baseOpnd_00 = IR::RegOpnd::New(TyInt64,func_00);
  pRVar9 = IR::Opnd::AsRegOpnd(this_00);
  uVar5 = Js::RecyclableObject::GetOffsetOfType();
  pIVar10 = IR::IndirOpnd::New(pRVar9,uVar5,TyInt64,func_00,false);
  Lowerer::InsertMove(&baseOpnd_00->super_Opnd,&pIVar10->super_Opnd,typeOfInstr,true);
  pRVar9 = IR::RegOpnd::New(TyUint32,func_00);
  uVar5 = Js::Type::GetOffsetOfTypeId();
  pIVar10 = IR::IndirOpnd::New(baseOpnd_00,uVar5,TyInt32,func_00,false);
  Lowerer::InsertMove(&pRVar9->super_Opnd,&pIVar10->super_Opnd,typeOfInstr,true);
  pIVar8 = IR::IntConstOpnd::New(0x58,TyUint32,func_00,false);
  Lowerer::InsertCompare(&pRVar9->super_Opnd,&pIVar8->super_Opnd,typeOfInstr);
  InsertCmovCC(CMOVB,&indexOpnd->super_Opnd,&pRVar9->super_Opnd,typeOfInstr,false);
  pRVar9 = IR::RegOpnd::New(TyUint32,func_00);
  pIVar8 = IR::IntConstOpnd::New(0,TyUint32,func_00,false);
  Lowerer::InsertMove(&pRVar9->super_Opnd,&pIVar8->super_Opnd,typeOfInstr,true);
  uVar5 = Js::Type::GetOffsetOfFlags();
  pIVar10 = IR::IndirOpnd::New(baseOpnd_00,uVar5,TyInt32,this->m_func,false);
  pIVar8 = IR::IntConstOpnd::New(2,TyInt32,this->m_func,false);
  Lowerer::InsertTest(&pIVar10->super_Opnd,&pIVar8->super_Opnd,typeOfInstr);
  InsertCmovCC(CMOVNE,&indexOpnd->super_Opnd,&pRVar9->super_Opnd,typeOfInstr,false);
  bVar2 = IR::Opnd::IsEqual(this_01,this_00);
  if (bVar2) {
    instr = IR::Instr::HoistSrc1(typeOfInstr,Ld_A,RegNOREG,(StackSym *)0x0);
    ChangeToAssign(instr);
  }
  scale = GetDefaultIndirScale();
  pIVar10 = IR::IndirOpnd::New(baseOpnd,indexOpnd,scale,TyUint64,func_00);
  Lowerer::InsertMove(this_01,&pIVar10->super_Opnd,typeOfInstr,true);
  Lowerer::InsertTestBranch(this_01,this_01,BrEq_A,target,typeOfInstr);
  Lowerer::InsertBranch(Br,target_00,typeOfInstr);
  IR::Instr::InsertBefore(typeOfInstr,&labelTarget->super_Instr);
  pIVar10 = IR::IndirOpnd::New(baseOpnd,0x20,TyUint64,func_00,false);
  Lowerer::InsertMove(this_01,&pIVar10->super_Opnd,typeOfInstr,true);
  Lowerer::InsertBranch(Br,target_00,typeOfInstr);
  IR::Instr::InsertBefore(typeOfInstr,&target->super_Instr);
  IR::Instr::InsertAfter(typeOfInstr,&target_00->super_Instr);
  Lowerer::LowerUnaryHelperMem(this->m_lowerer,typeOfInstr,HelperOp_Typeof,(Opnd *)0x0);
  return;
}

Assistant:

void
LowererMD::LowerTypeof(IR::Instr * typeOfInstr)
{
    Func * func = typeOfInstr->m_func;
    IR::Opnd * src1 = typeOfInstr->GetSrc1();
    IR::Opnd * dst = typeOfInstr->GetDst();
    Assert(src1->IsRegOpnd() && dst->IsRegOpnd());
    IR::LabelInstr * helperLabel = IR::LabelInstr::New(Js::OpCode::Label, func, true);
    IR::LabelInstr * taggedIntLabel = IR::LabelInstr::New(Js::OpCode::Label, func);
    IR::LabelInstr * doneLabel = IR::LabelInstr::New(Js::OpCode::Label, func);

    // MOV typeDisplayStringsArray, &javascriptLibrary->typeDisplayStrings
    IR::RegOpnd * typeDisplayStringsArrayOpnd = IR::RegOpnd::New(TyMachPtr, func);
    m_lowerer->InsertMove(typeDisplayStringsArrayOpnd, IR::AddrOpnd::New((BYTE*)m_func->GetScriptContextInfo()->GetLibraryAddr() + Js::JavascriptLibrary::GetTypeDisplayStringsOffset(), IR::AddrOpndKindConstantAddress, this->m_func), typeOfInstr);

    GenerateObjectTest(src1, typeOfInstr, taggedIntLabel);

    // MOV typeId, TypeIds_Object
    // MOV typeRegOpnd, [src1 + offset(Type)]
    // MOV objTypeId, [typeRegOpnd + offsetof(typeId)]
    // CMP objTypeId, TypeIds_Limit                                      /*external object test*/
    // CMOVB typeId, objTypeId
    // TEST [typeRegOpnd + offsetof(flags)], TypeFlagMask_IsFalsy        /*test for falsy*/
    // CMOVNE typeId, TypeIds_Undefined
    // MOV dst, typeDisplayStrings[typeId]
    // TEST dst, dst
    // JE $helper
    // JMP $done
    IR::RegOpnd * typeIdOpnd = IR::RegOpnd::New(TyUint32, func);
    m_lowerer->InsertMove(typeIdOpnd, IR::IntConstOpnd::New(Js::TypeIds_Object, TyUint32, func), typeOfInstr);

    IR::RegOpnd * typeRegOpnd = IR::RegOpnd::New(TyMachReg, func);
    m_lowerer->InsertMove(typeRegOpnd,
        IR::IndirOpnd::New(src1->AsRegOpnd(), Js::RecyclableObject::GetOffsetOfType(), TyMachReg, func),
        typeOfInstr);

    IR::RegOpnd * objTypeIdOpnd = IR::RegOpnd::New(TyUint32, func);
    m_lowerer->InsertMove(objTypeIdOpnd, IR::IndirOpnd::New(typeRegOpnd, Js::Type::GetOffsetOfTypeId(), TyInt32, func), typeOfInstr);

    m_lowerer->InsertCompare(objTypeIdOpnd, IR::IntConstOpnd::New(Js::TypeIds_Limit, TyUint32, func), typeOfInstr);
    InsertCmovCC(Js::OpCode::CMOVB, typeIdOpnd, objTypeIdOpnd, typeOfInstr);

    // Insert MOV reg, 0 before the TEST because MOV reg, 0 will be peeped to XOR reg, reg and that may affect the zero flags that CMOVE depends on
    IR::RegOpnd* typeIdUndefinedOpnd = IR::RegOpnd::New(TyUint32, func);
    m_lowerer->InsertMove(typeIdUndefinedOpnd, IR::IntConstOpnd::New(Js::TypeIds_Undefined, TyUint32, func), typeOfInstr);

    IR::Opnd *flagsOpnd = IR::IndirOpnd::New(typeRegOpnd, Js::Type::GetOffsetOfFlags(), TyInt32, this->m_func);
    m_lowerer->InsertTest(flagsOpnd, IR::IntConstOpnd::New(TypeFlagMask_IsFalsy, TyInt32, this->m_func), typeOfInstr);
    InsertCmovCC(Js::OpCode::CMOVNE, typeIdOpnd, typeIdUndefinedOpnd, typeOfInstr);

    if (dst->IsEqual(src1))
    {
        ChangeToAssign(typeOfInstr->HoistSrc1(Js::OpCode::Ld_A));
    }
    m_lowerer->InsertMove(dst, IR::IndirOpnd::New(typeDisplayStringsArrayOpnd, typeIdOpnd, this->GetDefaultIndirScale(), TyMachPtr, func), typeOfInstr);
    m_lowerer->InsertTestBranch(dst, dst, Js::OpCode::BrEq_A, helperLabel, typeOfInstr);

    m_lowerer->InsertBranch(Js::OpCode::Br, doneLabel, typeOfInstr);

    // $taggedInt:
    //   MOV dst, typeDisplayStrings[TypeIds_Number]
    //   JMP $done
    typeOfInstr->InsertBefore(taggedIntLabel);
    m_lowerer->InsertMove(dst, IR::IndirOpnd::New(typeDisplayStringsArrayOpnd, Js::TypeIds_Number * sizeof(Js::Var), TyMachPtr, func), typeOfInstr);
    m_lowerer->InsertBranch(Js::OpCode::Br, doneLabel, typeOfInstr);

    // $helper
    //   CALL OP_TypeOf
    // $done
    typeOfInstr->InsertBefore(helperLabel);
    typeOfInstr->InsertAfter(doneLabel);
    m_lowerer->LowerUnaryHelperMem(typeOfInstr, IR::HelperOp_Typeof);
}